

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QShaderDescription::BlockVariable>::copyAppend
          (QGenericArrayOps<QShaderDescription::BlockVariable> *this,BlockVariable *b,
          BlockVariable *e)

{
  BlockVariable *pBVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  int iVar5;
  long lVar6;
  
  if ((b != e) && (b < e)) {
    pBVar1 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).ptr;
    lVar6 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size;
    do {
      pDVar2 = (b->name).d.d;
      pBVar1[lVar6].name.d.d = pDVar2;
      pBVar1[lVar6].name.d.ptr = (b->name).d.ptr;
      pBVar1[lVar6].name.d.size = (b->name).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pBVar1[lVar6].size = b->size;
      iVar5 = b->offset;
      pBVar1[lVar6].type = b->type;
      pBVar1[lVar6].offset = iVar5;
      pDVar3 = (b->arrayDims).d.d;
      pBVar1[lVar6].arrayDims.d.d = pDVar3;
      pBVar1[lVar6].arrayDims.d.ptr = (b->arrayDims).d.ptr;
      pBVar1[lVar6].arrayDims.d.size = (b->arrayDims).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pBVar1[lVar6].matrixIsRowMajor = b->matrixIsRowMajor;
      iVar5 = b->matrixStride;
      pBVar1[lVar6].arrayStride = b->arrayStride;
      pBVar1[lVar6].matrixStride = iVar5;
      pDVar4 = (b->structMembers).d.d;
      pBVar1[lVar6].structMembers.d.d = pDVar4;
      pBVar1[lVar6].structMembers.d.ptr = (b->structMembers).d.ptr;
      pBVar1[lVar6].structMembers.d.size = (b->structMembers).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar6 = (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size + 1;
      (this->super_QArrayDataPointer<QShaderDescription::BlockVariable>).size = lVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }